

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O0

REF_STATUS ref_split_pass(REF_GRID ref_grid)

{
  REF_STATUS RVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool local_281;
  double local_260;
  double local_258;
  double local_250;
  double local_248;
  double local_238;
  double local_230;
  double local_220;
  double local_218;
  double local_208;
  byte local_1fd;
  uint local_1f8;
  REF_STATUS ref_private_macro_code_rss_54;
  REF_INT n_cavity;
  REF_STATUS ref_private_macro_code_rss_53;
  REF_STATUS ref_private_macro_code_rss_52;
  REF_STATUS ref_private_macro_code_rss_51;
  REF_STATUS ref_private_macro_code_rss_50;
  REF_STATUS ref_private_macro_code_rss_49;
  REF_STATUS ref_private_macro_code_rss_48;
  REF_STATUS ref_private_macro_code_rss_47;
  REF_STATUS ref_private_macro_code_rss_46;
  REF_STATUS ref_private_macro_code_rss_45;
  REF_STATUS ref_private_macro_code_rss_44;
  REF_STATUS ref_private_macro_code_rss_43;
  REF_STATUS ref_private_macro_code_rss_42;
  REF_STATUS ref_private_macro_code_rss_41;
  REF_STATUS ref_private_macro_code_rss_40;
  REF_STATUS ref_private_macro_code_rss_39;
  REF_STATUS ref_private_macro_code_rss_38;
  REF_STATUS ref_private_macro_code_rss_37;
  REF_STATUS ref_private_macro_code_rss_36;
  REF_STATUS ref_private_macro_code_rss_35;
  REF_BOOL normdev_improved_1;
  REF_STATUS ref_private_macro_code_rss_34;
  REF_STATUS ref_private_macro_code_rss_33;
  REF_STATUS ref_private_macro_code_rss_32;
  REF_STATUS ref_private_macro_code_rss_31;
  REF_STATUS ref_private_macro_code_rss_30;
  REF_STATUS ref_private_macro_code_rss_29;
  REF_STATUS ref_private_macro_code_rss_28;
  REF_STATUS ref_private_macro_code_rss_27;
  REF_BOOL normdev_improved;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_DBL d1;
  REF_DBL d0;
  uint local_140;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL weight_node1;
  REF_DBL ratio1;
  REF_DBL ratio0;
  REF_DBL ratio01;
  REF_BOOL transcript;
  REF_STATUS status;
  REF_SUBDIV ref_subdiv;
  REF_LIST para_cavity;
  REF_LIST para_no_geom;
  REF_CAVITY pRStack_b8;
  REF_BOOL span_parts;
  REF_CAVITY ref_cavity;
  REF_INT local_a8;
  REF_INT new_node;
  REF_INT node1;
  REF_INT node0;
  REF_GLOB global;
  REF_DBL min_add;
  REF_DBL min_del;
  REF_BOOL allowed_tri_quality;
  REF_BOOL has_edge;
  REF_BOOL allowed_cavity_ratio;
  REF_BOOL try_cavity;
  REF_BOOL valid_cavity;
  REF_BOOL geom_support;
  REF_BOOL allowed_local;
  REF_BOOL allowed;
  REF_BOOL allowed_tet_quality;
  REF_BOOL allowed_tri_conformity;
  REF_BOOL allowed_ratio;
  REF_INT edge;
  REF_INT n;
  REF_INT i;
  REF_INT *order;
  REF_INT *edges;
  REF_DBL *ratio;
  REF_EDGE ref_edge;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_GRID ref_grid_local;
  
  ref_node = (REF_NODE)ref_grid->mpi;
  ref_cell = (REF_CELL)ref_grid->node;
  pRStack_b8 = (REF_CAVITY)0x0;
  para_cavity = (REF_LIST)0x0;
  ref_subdiv = (REF_SUBDIV)0x0;
  _transcript = (REF_SUBDIV)0x0;
  ratio01._0_4_ = 0;
  ref_edge = (REF_EDGE)ref_grid->cell[8];
  if ((ref_grid->twod != 0) || (ref_grid->surf != 0)) {
    ref_edge = (REF_EDGE)ref_grid->cell[3];
  }
  local_1fd = 0;
  if ((1 < ref_grid->mpi->n) && (local_1fd = 0, ref_grid->twod == 0)) {
    local_1fd = ref_grid->surf != 0 ^ 0xff;
  }
  para_no_geom._4_4_ = (uint)(local_1fd & 1);
  ref_mpi = (REF_MPI)ref_grid;
  if (para_no_geom._4_4_ != 0) {
    ref_private_macro_code_rss_2 = ref_list_create(&para_cavity);
    if (ref_private_macro_code_rss_2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x6d,
             "ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_2,"list for stuck edges");
      return ref_private_macro_code_rss_2;
    }
    ref_private_macro_code_rss_3 = ref_list_create((REF_LIST *)&ref_subdiv);
    if (ref_private_macro_code_rss_3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x6e,
             "ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_3,"list for stuck cavity");
      return ref_private_macro_code_rss_3;
    }
    ref_private_macro_code_rss_3 = 0;
  }
  ref_private_macro_code_rss_4 = ref_edge_create((REF_EDGE *)&ratio,(REF_GRID)ref_mpi);
  if (ref_private_macro_code_rss_4 == 0) {
    if (*(int *)ratio < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x73,
             "ref_split_pass","malloc ratio of REF_DBL negative");
      ref_grid_local._4_4_ = 1;
    }
    else {
      edges = (REF_INT *)malloc((long)*(int *)ratio << 3);
      if (edges == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
               0x73,"ref_split_pass","malloc ratio of REF_DBL NULL");
        ref_grid_local._4_4_ = 2;
      }
      else if (*(int *)ratio < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
               0x74,"ref_split_pass","malloc order of REF_INT negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        _n = (REF_INT *)malloc((long)*(int *)ratio << 2);
        if (_n == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
                 0x74,"ref_split_pass","malloc order of REF_INT NULL");
          ref_grid_local._4_4_ = 2;
        }
        else if (*(int *)ratio < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",
                 0x75,"ref_split_pass","malloc edges of REF_INT negative");
          ref_grid_local._4_4_ = 1;
        }
        else {
          order = (REF_INT *)malloc((long)*(int *)ratio << 2);
          if (order == (REF_INT *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                   ,0x75,"ref_split_pass","malloc edges of REF_INT NULL");
            ref_grid_local._4_4_ = 2;
          }
          else {
            allowed_ratio = 0;
            for (allowed_tri_conformity = 0; allowed_tri_conformity < *(int *)ratio;
                allowed_tri_conformity = allowed_tri_conformity + 1) {
              new_node = *(REF_INT *)((long)ratio[1] + (long)(allowed_tri_conformity << 1) * 4);
              local_a8 = *(REF_INT *)((long)ratio[1] + (long)(allowed_tri_conformity * 2 + 1) * 4);
              ref_private_macro_code_rss_5 =
                   ref_node_ratio((REF_NODE)ref_cell,new_node,local_a8,
                                  (REF_DBL *)(edges + (long)allowed_ratio * 2));
              if (ref_private_macro_code_rss_5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                       ,0x7b,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_5,"ratio");
                return ref_private_macro_code_rss_5;
              }
              if (*(double *)(*(long *)(ref_mpi + 3) + 8) <=
                  *(double *)(edges + (long)allowed_ratio * 2) &&
                  *(double *)(edges + (long)allowed_ratio * 2) !=
                  *(double *)(*(long *)(ref_mpi + 3) + 8)) {
                order[allowed_ratio] = allowed_tri_conformity;
                allowed_ratio = allowed_ratio + 1;
              }
              ref_private_macro_code_rss_5 = 0;
            }
            ref_private_macro_code_rss_6 = ref_sort_heap_dbl(allowed_ratio,(REF_DBL *)edges,_n);
            if (ref_private_macro_code_rss_6 == 0) {
              ref_private_macro_code_rss_6 = 0;
              edge = allowed_ratio;
LAB_002607ae:
              edge = edge + -1;
              if (-1 < edge) {
                allowed_tri_conformity = order[_n[edge]];
                new_node = *(REF_INT *)((long)ratio[1] + (long)(allowed_tri_conformity << 1) * 4);
                local_a8 = *(REF_INT *)((long)ratio[1] + (long)(allowed_tri_conformity * 2 + 1) * 4)
                ;
                if (ratio01._0_4_ != 0) {
                  printf("transcript on ratio %f\n",*(undefined8 *)(edges + (long)_n[edge] * 2));
                }
                ref_private_macro_code_rss_7 =
                     ref_cell_has_side((REF_CELL)ref_edge,new_node,local_a8,&geom_support);
                if (ref_private_macro_code_rss_7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                         ,0x8c,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_7,"has side"
                        );
                  return ref_private_macro_code_rss_7;
                }
                if ((ratio01._0_4_ != 0) && (geom_support == 0)) {
                  printf("not a side anymore\n");
                }
                if (geom_support != 0) {
                  if ((*(int *)(*(long *)&ref_cell[1].size_per + 4) !=
                       *(int *)(*(long *)&ref_cell->n + (long)new_node * 4)) &&
                     (*(int *)(*(long *)&ref_cell[1].size_per + 4) !=
                      *(int *)(*(long *)&ref_cell->n + (long)local_a8 * 4))) {
                    if (ratio01._0_4_ != 0) {
                      printf("neither node is local\n");
                    }
                    goto LAB_002607ae;
                  }
                  ref_private_macro_code_rss_8 =
                       ref_split_edge_mixed((REF_GRID)ref_mpi,new_node,local_a8,&geom_support);
                  if (ref_private_macro_code_rss_8 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0x96,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_8,"mixed")
                    ;
                    return ref_private_macro_code_rss_8;
                  }
                  if ((ratio01._0_4_ != 0) && (geom_support == 0)) {
                    printf("mixed edge\n");
                  }
                  if (geom_support == 0) goto LAB_002607ae;
                  _ref_private_macro_code_rss_1 = 0.5;
                  if ((ref_mpi[4].native_alltoallv != 0) || (ref_mpi[4].debug != 0)) {
                    ref_private_macro_code_rss_9 =
                         ref_node_ratio((REF_NODE)ref_cell,new_node,local_a8,&ratio0);
                    if (ref_private_macro_code_rss_9 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                             ,0x9c,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_9,
                             "ratio01");
                      return ref_private_macro_code_rss_9;
                    }
                    ref_private_macro_code_rss_10 =
                         ref_node_ratio_node0((REF_NODE)ref_cell,new_node,local_a8,&ratio1);
                    if (ref_private_macro_code_rss_10 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                             ,0x9d,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_10,
                             "ratio0");
                      return ref_private_macro_code_rss_10;
                    }
                    ref_private_macro_code_rss_11 =
                         ref_node_ratio_node0((REF_NODE)ref_cell,local_a8,new_node,&weight_node1);
                    if (ref_private_macro_code_rss_11 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                             ,0x9e,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_11,
                             "ratio1");
                      return ref_private_macro_code_rss_11;
                    }
                    if (weight_node1 * 1e+20 + ratio1 <= 0.0) {
                      local_208 = -(weight_node1 * 1e+20 + ratio1);
                    }
                    else {
                      local_208 = weight_node1 * 1e+20 + ratio1;
                    }
                    if (ratio1 <= 0.0) {
                      local_218 = -ratio1;
                    }
                    else {
                      local_218 = ratio1;
                    }
                    if (local_218 < local_208) {
                      if ((ratio1 / (ratio1 + weight_node1) <= 0.25) ||
                         (0.75 <= ratio1 / (ratio1 + weight_node1))) {
                        if (weight_node1 <= ratio1) {
                          if (ratio0 * 1e+20 <= 0.0) {
                            local_238 = -(ratio0 * 1e+20);
                          }
                          else {
                            local_238 = ratio0 * 1e+20;
                          }
                          if (weight_node1 <= 0.0) {
                            local_248 = -weight_node1;
                          }
                          else {
                            local_248 = weight_node1;
                          }
                          if (local_248 < local_238) {
                            _ref_private_macro_code_rss_1 = weight_node1 / ratio0;
                          }
                        }
                        else {
                          if (ratio0 * 1e+20 <= 0.0) {
                            local_220 = -(ratio0 * 1e+20);
                          }
                          else {
                            local_220 = ratio0 * 1e+20;
                          }
                          if (ratio1 <= 0.0) {
                            local_230 = -ratio1;
                          }
                          else {
                            local_230 = ratio1;
                          }
                          if (local_230 < local_220) {
                            _ref_private_macro_code_rss_1 = 1.0 - ratio1 / ratio0;
                          }
                        }
                      }
                      else {
                        _ref_private_macro_code_rss_1 = 1.0 - ratio1 / (ratio1 + weight_node1);
                      }
                    }
                    ref_private_macro_code_rss_11 = 0;
                  }
                  if (0.05 <= _ref_private_macro_code_rss_1) {
                    local_250 = _ref_private_macro_code_rss_1;
                  }
                  else {
                    local_250 = 0.05;
                  }
                  if (local_250 <= 0.95) {
                    if (0.05 <= _ref_private_macro_code_rss_1) {
                      local_260 = _ref_private_macro_code_rss_1;
                    }
                    else {
                      local_260 = 0.05;
                    }
                    local_258 = local_260;
                  }
                  else {
                    local_258 = 0.95;
                  }
                  _ref_private_macro_code_rss_1 = local_258;
                  if (ratio01._0_4_ != 0) {
                    printf("weight_node1 %f\n",local_258);
                  }
                  ref_private_macro_code_rss_12 =
                       ref_node_next_global((REF_NODE)ref_cell,(REF_GLOB *)&node1);
                  if (ref_private_macro_code_rss_12 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0xb1,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_12,
                           "next global");
                    return ref_private_macro_code_rss_12;
                  }
                  ref_private_macro_code_rss_13 =
                       ref_node_add((REF_NODE)ref_cell,_node1,(REF_INT *)((long)&ref_cavity + 4));
                  if (ref_private_macro_code_rss_13 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0xb2,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_13,
                           "new node");
                    return ref_private_macro_code_rss_13;
                  }
                  ref_private_macro_code_rss_14 =
                       ref_node_interpolate_edge
                                 ((REF_NODE)ref_cell,new_node,local_a8,_ref_private_macro_code_rss_1
                                  ,ref_cavity._4_4_);
                  if (ref_private_macro_code_rss_14 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0xb5,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_14,
                           "interp new node");
                    return ref_private_macro_code_rss_14;
                  }
                  ref_private_macro_code_rss_15 =
                       ref_geom_add_between
                                 ((REF_GRID)ref_mpi,new_node,local_a8,_ref_private_macro_code_rss_1,
                                  ref_cavity._4_4_);
                  if (ref_private_macro_code_rss_15 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0xb7,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_15,
                           "geom new node");
                    return ref_private_macro_code_rss_15;
                  }
                  ref_private_macro_code_rss_16 =
                       ref_geom_constrain((REF_GRID)ref_mpi,ref_cavity._4_4_);
                  if (ref_private_macro_code_rss_16 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0xb8,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_16,
                           "geom constraint");
                    return ref_private_macro_code_rss_16;
                  }
                  local_140 = ref_metric_interpolate_between
                                        ((REF_GRID)ref_mpi,new_node,local_a8,ref_cavity._4_4_);
                  if (local_140 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0xba,"ref_split_pass",(ulong)local_140,"interp new node metric");
                    return local_140;
                  }
                  d0._4_4_ = ref_geom_supported(*(REF_GEOM *)&ref_mpi[2].native_alltoallv,
                                                ref_cavity._4_4_,&try_cavity);
                  if (d0._4_4_ != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0xbc,"ref_split_pass",(ulong)d0._4_4_,"geom support");
                    return d0._4_4_;
                  }
                  if ((ratio01._0_4_ != 0) && (try_cavity != 0)) {
                    printf("geom support\n");
                  }
                  if (ratio01._0_4_ != 0) {
                    dVar3 = pow(*(double *)(ref_cell->c2n + (long)(new_node * 0xf) * 2) -
                                *(double *)(ref_cell->c2n + (long)(ref_cavity._4_4_ * 0xf) * 2),2.0)
                    ;
                    dVar4 = pow(*(double *)(ref_cell->c2n + (long)(new_node * 0xf + 1) * 2) -
                                *(double *)(ref_cell->c2n + (long)(ref_cavity._4_4_ * 0xf + 1) * 2),
                                2.0);
                    dVar5 = pow(*(double *)(ref_cell->c2n + (long)(new_node * 0xf + 2) * 2) -
                                *(double *)(ref_cell->c2n + (long)(ref_cavity._4_4_ * 0xf + 2) * 2),
                                2.0);
                    d1 = sqrt(dVar3 + dVar4 + dVar5);
                    dVar3 = pow(*(double *)(ref_cell->c2n + (long)(local_a8 * 0xf) * 2) -
                                *(double *)(ref_cell->c2n + (long)(ref_cavity._4_4_ * 0xf) * 2),2.0)
                    ;
                    dVar4 = pow(*(double *)(ref_cell->c2n + (long)(local_a8 * 0xf + 1) * 2) -
                                *(double *)(ref_cell->c2n + (long)(ref_cavity._4_4_ * 0xf + 1) * 2),
                                2.0);
                    dVar5 = pow(*(double *)(ref_cell->c2n + (long)(local_a8 * 0xf + 2) * 2) -
                                *(double *)(ref_cell->c2n + (long)(ref_cavity._4_4_ * 0xf + 2) * 2),
                                2.0);
                    _ref_private_macro_code_rss_18 = sqrt(dVar3 + dVar4 + dVar5);
                    printf("w1 %f xyz %f %f %f d %f %f\nbetween %f %f %f %f %f %f\n",
                           _ref_private_macro_code_rss_1,
                           *(undefined8 *)(ref_cell->c2n + (long)(ref_cavity._4_4_ * 0xf) * 2),
                           *(undefined8 *)(ref_cell->c2n + (long)(ref_cavity._4_4_ * 0xf + 1) * 2),
                           *(undefined8 *)(ref_cell->c2n + (long)(ref_cavity._4_4_ * 0xf + 2) * 2),
                           d1,_ref_private_macro_code_rss_18,
                           *(undefined8 *)(ref_cell->c2n + (long)(new_node * 0xf) * 2),
                           *(undefined8 *)(ref_cell->c2n + (long)(new_node * 0xf + 1) * 2));
                  }
                  ref_private_macro_code_rss_19 =
                       ref_split_edge_tet_quality
                                 ((REF_GRID)ref_mpi,new_node,local_a8,ref_cavity._4_4_,
                                  &allowed_local);
                  if (ref_private_macro_code_rss_19 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0xdf,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_19,
                           "edge tet qual");
                    return ref_private_macro_code_rss_19;
                  }
                  if ((ratio01._0_4_ != 0) && (allowed_local == 0)) {
                    printf("tet quality poor\n");
                  }
                  ref_private_macro_code_rss_20 =
                       ref_split_edge_tri_quality
                                 ((REF_GRID)ref_mpi,new_node,local_a8,ref_cavity._4_4_,
                                  (REF_BOOL *)&min_del);
                  if (ref_private_macro_code_rss_20 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0xe4,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_20,
                           "quality of new tri");
                    return ref_private_macro_code_rss_20;
                  }
                  if ((ratio01._0_4_ != 0) && (min_del._0_4_ == 0)) {
                    printf("tri quality poor\n");
                  }
                  ref_private_macro_code_rss_21 =
                       ref_split_edge_ratio
                                 ((REF_GRID)ref_mpi,new_node,local_a8,ref_cavity._4_4_,
                                  &allowed_tet_quality);
                  if (ref_private_macro_code_rss_21 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0xe8,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_21,
                           "edge tet ratio");
                    return ref_private_macro_code_rss_21;
                  }
                  if ((ratio01._0_4_ != 0) && (allowed_tet_quality == 0)) {
                    printf("ratio poor\n");
                  }
                  ref_private_macro_code_rss_22 =
                       ref_split_edge_tri_conformity
                                 (ratio01._0_4_,(REF_GRID)ref_mpi,new_node,local_a8,ref_cavity._4_4_
                                  ,&allowed);
                  if (ref_private_macro_code_rss_22 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0xed,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_22,
                           "edge tri qual");
                    return ref_private_macro_code_rss_22;
                  }
                  if ((ratio01._0_4_ != 0) && (allowed == 0)) {
                    printf("tri conformity poor\n");
                  }
                  ref_private_macro_code_rss_23 =
                       ref_cell_has_side((REF_CELL)ref_mpi->comm,new_node,local_a8,
                                         (REF_BOOL *)((long)&min_del + 4));
                  if (ref_private_macro_code_rss_23 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0xf1,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_23,
                           "check for an edge");
                    return ref_private_macro_code_rss_23;
                  }
                  if ((ratio01._0_4_ != 0) && (min_del._4_4_ != 0)) {
                    printf("has geom edge\n");
                  }
                  has_edge = 0;
                  if ((((allowed_local == 0) || (allowed_tet_quality == 0)) || (allowed == 0)) ||
                     (min_del._0_4_ == 0)) {
                    if (try_cavity == 0) {
                      ref_private_macro_code_rss_24 =
                           ref_node_remove((REF_NODE)ref_cell,ref_cavity._4_4_);
                      if (ref_private_macro_code_rss_24 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                               ,0xfa,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_24,
                               "remove new node");
                        return ref_private_macro_code_rss_24;
                      }
                      ref_private_macro_code_rss_25 =
                           ref_geom_remove_all(*(REF_GEOM *)&ref_mpi[2].native_alltoallv,
                                               ref_cavity._4_4_);
                      if (ref_private_macro_code_rss_25 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                               ,0xfb,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_25,
                               "rm");
                        return ref_private_macro_code_rss_25;
                      }
                      ref_private_macro_code_rss_25 = 0;
                      goto LAB_002607ae;
                    }
                    has_edge = 1;
                  }
                  if (has_edge == 0) {
                    ref_private_macro_code_rss_42 =
                         ref_cell_local_gem((REF_CELL)ref_edge,(REF_NODE)ref_cell,new_node,local_a8,
                                            &valid_cavity);
                    if (ref_private_macro_code_rss_42 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                             ,0x141,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_42,
                             "local tet");
                      return ref_private_macro_code_rss_42;
                    }
                    if (valid_cavity == 0) {
                      if (para_no_geom._4_4_ == 0) {
                        *(int *)(*(long *)&ref_cell->blank + (long)new_node * 4) =
                             *(int *)(*(long *)&ref_cell->blank + (long)new_node * 4) + 1;
                        *(int *)(*(long *)&ref_cell->blank + (long)local_a8 * 4) =
                             *(int *)(*(long *)&ref_cell->blank + (long)local_a8 * 4) + 1;
                      }
                      else {
                        ref_private_macro_code_rss_43 =
                             ref_list_push(para_cavity,allowed_tri_conformity);
                        if (ref_private_macro_code_rss_43 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                 ,0x144,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_43,
                                 "push");
                          return ref_private_macro_code_rss_43;
                        }
                        ref_private_macro_code_rss_43 = 0;
                      }
                      ref_private_macro_code_rss_44 =
                           ref_node_remove((REF_NODE)ref_cell,ref_cavity._4_4_);
                      if (ref_private_macro_code_rss_44 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                               ,0x149,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_44,
                               "remove new node");
                        return ref_private_macro_code_rss_44;
                      }
                      ref_private_macro_code_rss_45 =
                           ref_geom_remove_all(*(REF_GEOM *)&ref_mpi[2].native_alltoallv,
                                               ref_cavity._4_4_);
                      if (ref_private_macro_code_rss_45 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                               ,0x14a,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_45,
                               "rm");
                        return ref_private_macro_code_rss_45;
                      }
                      ref_private_macro_code_rss_45 = 0;
                    }
                    else {
                      if (ratio01._0_4_ != 0) {
                        printf("split\n");
                      }
                      ratio01._4_4_ =
                           ref_split_edge((REF_GRID)ref_mpi,new_node,local_a8,ref_cavity._4_4_);
                      if (ratio01._4_4_ == 7) {
                        ref_private_macro_code_rss_46 =
                             ref_node_remove((REF_NODE)ref_cell,ref_cavity._4_4_);
                        if (ref_private_macro_code_rss_46 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                 ,0x151,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_46,
                                 "remove new node");
                          return ref_private_macro_code_rss_46;
                        }
                        ref_private_macro_code_rss_47 =
                             ref_geom_remove_all(*(REF_GEOM *)&ref_mpi[2].native_alltoallv,
                                                 ref_cavity._4_4_);
                        if (ref_private_macro_code_rss_47 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                 ,0x152,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_47,
                                 "rm");
                          return ref_private_macro_code_rss_47;
                        }
                        ref_private_macro_code_rss_47 = 0;
                      }
                      else {
                        ref_private_macro_code_rss_48 = ratio01._4_4_;
                        if (ratio01._4_4_ != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                 ,0x155,"ref_split_pass",(ulong)ratio01._4_4_,"tet edge split");
                          return ref_private_macro_code_rss_48;
                        }
                        if (ratio01._0_4_ != 0) {
                          ref_private_macro_code_rss_49 =
                               ref_split_edge_ratio_post_report
                                         ((REF_GRID)ref_mpi,new_node,local_a8,ref_cavity._4_4_);
                          if (ref_private_macro_code_rss_49 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                   ,0x159,"ref_split_pass",
                                   (ulong)(uint)ref_private_macro_code_rss_49,"report ratio");
                            return ref_private_macro_code_rss_49;
                          }
                          ref_private_macro_code_rss_49 = 0;
                        }
                        *(undefined4 *)(*(long *)&ref_cell->blank + (long)new_node * 4) = 0;
                        *(undefined4 *)(*(long *)&ref_cell->blank + (long)local_a8 * 4) = 0;
                        ref_private_macro_code_rss_50 =
                             ref_smooth_post_edge_split((REF_GRID)ref_mpi,ref_cavity._4_4_);
                        if (ref_private_macro_code_rss_50 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                                 ,0x15d,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_50,
                                 "smooth after split");
                          return ref_private_macro_code_rss_50;
                        }
                        ref_private_macro_code_rss_50 = 0;
                      }
                    }
                    goto LAB_002607ae;
                  }
                  ref_private_macro_code_rss_26 = ref_cavity_create(&stack0xffffffffffffff48);
                  if (ref_private_macro_code_rss_26 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0x101,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_26,
                           "cav create");
                    return ref_private_macro_code_rss_26;
                  }
                  pRStack_b8->debug = ratio01._0_4_;
                  if ((ref_mpi[4].debug != 0) && (min_del._4_4_ != 0)) {
                    normdev_improved = ref_node_ratio((REF_NODE)ref_cell,new_node,local_a8,&ratio0);
                    if (normdev_improved != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                             ,0x104,"ref_split_pass",(ulong)(uint)normdev_improved,"ratio01");
                      return normdev_improved;
                    }
                    if (5.0 < ratio0) {
                      pRStack_b8->min_normdev = 0.0;
                    }
                    normdev_improved = 0;
                  }
                  ref_private_macro_code_rss_27 =
                       ref_cavity_form_edge_split
                                 (pRStack_b8,(REF_GRID)ref_mpi,new_node,local_a8,ref_cavity._4_4_);
                  if (ref_private_macro_code_rss_27 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0x109,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_27,
                           "form edge split cav");
                    return ref_private_macro_code_rss_27;
                  }
                  if (ratio01._0_4_ != 0) {
                    ref_private_macro_code_rss_29 =
                         ref_cavity_normdev(pRStack_b8,&ref_private_macro_code_rss_28);
                    if (ref_private_macro_code_rss_29 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                             ,0x10c,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_29,"nd"
                            );
                      return ref_private_macro_code_rss_29;
                    }
                    printf("form cavity status %d min normdev %f\n",pRStack_b8->min_normdev,
                           (ulong)pRStack_b8->state);
                  }
                  RVar1 = ref_cavity_enlarge_combined(pRStack_b8);
                  if (RVar1 != 0) {
                    ref_private_macro_code_rss_30 = ref_grid_tattle((REF_GRID)ref_mpi,new_node);
                    if (ref_private_macro_code_rss_30 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                             ,0x112,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_30,
                             "tattle node0");
                      return ref_private_macro_code_rss_30;
                    }
                    ref_private_macro_code_rss_31 = ref_grid_tattle((REF_GRID)ref_mpi,local_a8);
                    if (ref_private_macro_code_rss_31 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                             ,0x113,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_31,
                             "tattle node1");
                      return ref_private_macro_code_rss_31;
                    }
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0x114,"ref_split_pass","enlarge");
                  }
                  if (pRStack_b8->state == REF_CAVITY_VISIBLE) {
                    if (ratio01._0_4_ != 0) {
                      printf("cavity visible\n");
                    }
                    ref_private_macro_code_rss_32 =
                         ref_cavity_ratio(pRStack_b8,&allowed_tri_quality);
                    if (ref_private_macro_code_rss_32 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                             ,0x119,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_32,
                             "cavity ratio");
                      return ref_private_macro_code_rss_32;
                    }
                    ref_private_macro_code_rss_33 =
                         ref_cavity_change(pRStack_b8,&min_add,(REF_DBL *)&global);
                    if (ref_private_macro_code_rss_33 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                             ,0x11a,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_33,
                             "cavity change");
                      return ref_private_macro_code_rss_33;
                    }
                    if ((allowed_tri_quality != 0) || (local_281 = false, min_del._4_4_ != 0)) {
                      local_281 = *(double *)(*(long *)(ref_mpi + 3) + 0x10) <= (double)global &&
                                  (double)global != *(double *)(*(long *)(ref_mpi + 3) + 0x10);
                    }
                    allowed_cavity_ratio = (REF_BOOL)local_281;
                    if ((ratio01._0_4_ != 0) && (allowed_cavity_ratio == 0)) {
                      printf("valid_cavity edge %d ratio %d add %d %f\n",global,(ulong)min_del._4_4_
                             ,(ulong)(uint)allowed_tri_quality,
                             (ulong)(*(double *)(*(long *)(ref_mpi + 3) + 0x10) <= (double)global &&
                                    (double)global != *(double *)(*(long *)(ref_mpi + 3) + 0x10)));
                    }
                    if (allowed_cavity_ratio != 0) {
                      if (ratio01._0_4_ != 0) {
                        printf("cavity replace\n");
                      }
                      ref_private_macro_code_rss_34 = ref_cavity_replace(pRStack_b8);
                      if (ref_private_macro_code_rss_34 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                               ,0x126,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_34,
                               "cav replace");
                        return ref_private_macro_code_rss_34;
                      }
                      normdev_improved_1 = ref_cavity_free(pRStack_b8);
                      if (normdev_improved_1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                               ,0x127,"ref_split_pass",(ulong)(uint)normdev_improved_1,"cav free");
                        return normdev_improved_1;
                      }
                      pRStack_b8 = (REF_CAVITY)0x0;
                      *(undefined4 *)(*(long *)&ref_cell->blank + (long)new_node * 4) = 0;
                      *(undefined4 *)(*(long *)&ref_cell->blank + (long)local_a8 * 4) = 0;
                      ref_private_macro_code_rss_35 =
                           ref_smooth_post_edge_split((REF_GRID)ref_mpi,ref_cavity._4_4_);
                      if (ref_private_macro_code_rss_35 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                               ,300,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_35,
                               "smooth after split");
                        return ref_private_macro_code_rss_35;
                      }
                      ref_private_macro_code_rss_35 = 0;
                      goto LAB_002607ae;
                    }
                  }
                  else if (ratio01._0_4_ != 0) {
                    ref_private_macro_code_rss_37 =
                         ref_cavity_normdev(pRStack_b8,&ref_private_macro_code_rss_36);
                    if (ref_private_macro_code_rss_37 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                             ,0x132,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_37,"nd"
                            );
                      return ref_private_macro_code_rss_37;
                    }
                    printf("cavity not visible %d\n",(ulong)pRStack_b8->state);
                  }
                  if ((pRStack_b8->state == REF_CAVITY_PARTITION_CONSTRAINED) &&
                     (para_no_geom._4_4_ != 0)) {
                    ref_private_macro_code_rss_38 =
                         ref_list_push((REF_LIST)ref_subdiv,allowed_tri_conformity);
                    if (ref_private_macro_code_rss_38 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                             ,0x137,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_38,
                             "push");
                      return ref_private_macro_code_rss_38;
                    }
                    ref_private_macro_code_rss_38 = 0;
                  }
                  ref_private_macro_code_rss_39 = ref_cavity_free(pRStack_b8);
                  if (ref_private_macro_code_rss_39 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0x139,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_39,
                           "cav free");
                    return ref_private_macro_code_rss_39;
                  }
                  pRStack_b8 = (REF_CAVITY)0x0;
                  ref_private_macro_code_rss_40 =
                       ref_node_remove((REF_NODE)ref_cell,ref_cavity._4_4_);
                  if (ref_private_macro_code_rss_40 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0x13b,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_40,
                           "remove new node");
                    return ref_private_macro_code_rss_40;
                  }
                  ref_private_macro_code_rss_41 =
                       ref_geom_remove_all(*(REF_GEOM *)&ref_mpi[2].native_alltoallv,
                                           ref_cavity._4_4_);
                  if (ref_private_macro_code_rss_41 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0x13c,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_41,"rm");
                    return ref_private_macro_code_rss_41;
                  }
                  ref_private_macro_code_rss_41 = 0;
                }
                goto LAB_002607ae;
              }
              if (order != (REF_INT *)0x0) {
                free(order);
              }
              if (_n != (REF_INT *)0x0) {
                free(_n);
              }
              if (edges != (REF_INT *)0x0) {
                free(edges);
              }
              if (para_no_geom._4_4_ != 0) {
                if (0 < *(int *)(*(long *)(ref_mpi + 3) + 0x7c)) {
                  ref_mpi_stopwatch_stop(*(REF_MPI *)ref_mpi,"spl int");
                }
                ref_private_macro_code_rss_51 =
                     ref_subdiv_create((REF_SUBDIV *)&transcript,(REF_GRID)ref_mpi);
                if (ref_private_macro_code_rss_51 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                         ,0x167,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_51,"create"
                        );
                  return ref_private_macro_code_rss_51;
                }
                _transcript->new_mark_allowed = 0;
                _transcript->instrument = 1;
                ref_private_macro_code_rss_51 = 0;
                for (edge = 0; edge < para_cavity->n; edge = edge + 1) {
                  allowed_tri_conformity = para_cavity->value[edge];
                  new_node = *(REF_INT *)((long)ratio[1] + (long)(allowed_tri_conformity << 1) * 4);
                  local_a8 = *(REF_INT *)
                              ((long)ratio[1] + (long)(allowed_tri_conformity * 2 + 1) * 4);
                  ref_private_macro_code_rss_52 =
                       ref_cell_has_side((REF_CELL)ref_mpi[1].start_time,new_node,local_a8,
                                         &geom_support);
                  if (ref_private_macro_code_rss_52 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                           ,0x16f,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_52,
                           "has side");
                    return ref_private_macro_code_rss_52;
                  }
                  if (geom_support != 0) {
                    ref_private_macro_code_rss_53 =
                         ref_subdiv_mark_to_split(_transcript,new_node,local_a8);
                    if (ref_private_macro_code_rss_53 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                             ,0x173,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_53,
                             "mark edge to para split");
                      return ref_private_macro_code_rss_53;
                    }
                    ref_private_macro_code_rss_53 = 0;
                  }
                }
                n_cavity = ref_subdiv_split(_transcript);
                if (n_cavity != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                         ,0x176,"ref_split_pass",(ulong)(uint)n_cavity,"split");
                  return n_cavity;
                }
                ref_private_macro_code_rss_54 = ref_subdiv_free(_transcript);
                if (ref_private_macro_code_rss_54 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                         ,0x177,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_54,"free");
                  return ref_private_macro_code_rss_54;
                }
                local_1f8 = *(uint *)&ref_subdiv->grid;
                uVar2 = ref_mpi_allsum((REF_MPI)ref_node,&local_1f8,1,1);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                         ,0x17c,"ref_split_pass",(ulong)uVar2,"cavs");
                  return uVar2;
                }
                if (ref_node->max == 0) {
                  printf("cavities with part constraints %d\n",(ulong)local_1f8);
                }
                ref_list_free(para_cavity);
                ref_list_free((REF_LIST)ref_subdiv);
              }
              ref_edge_free((REF_EDGE)ratio);
              ref_grid_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c"
                     ,0x82,"ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_6,"sort lengths"
                    );
              ref_grid_local._4_4_ = ref_private_macro_code_rss_6;
            }
          }
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x71,
           "ref_split_pass",(ulong)(uint)ref_private_macro_code_rss_4,"orig edges");
    ref_grid_local._4_4_ = ref_private_macro_code_rss_4;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_split_pass(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_EDGE ref_edge;
  REF_DBL *ratio;
  REF_INT *edges, *order;
  REF_INT i, n, edge;
  REF_BOOL allowed_ratio, allowed_tri_conformity, allowed_tet_quality;
  REF_BOOL allowed, allowed_local, geom_support, valid_cavity, try_cavity;
  REF_BOOL allowed_cavity_ratio, has_edge;
  REF_BOOL allowed_tri_quality;
  REF_DBL min_del, min_add;
  REF_GLOB global;
  REF_INT node0, node1;
  REF_INT new_node;
  REF_CAVITY ref_cavity = (REF_CAVITY)NULL;
  REF_BOOL span_parts;
  REF_LIST para_no_geom = NULL;
  REF_LIST para_cavity = NULL;
  REF_SUBDIV ref_subdiv = NULL;
  REF_STATUS status;
  REF_BOOL transcript = REF_FALSE;
  REF_DBL ratio01, ratio0, ratio1, weight_node1;

  ref_cell = ref_grid_tet(ref_grid);
  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid))
    ref_cell = ref_grid_tri(ref_grid);

  span_parts = ref_mpi_para(ref_grid_mpi(ref_grid)) &&
               !ref_grid_twod(ref_grid) && !ref_grid_surf(ref_grid);

  if (span_parts) {
    RSS(ref_list_create(&para_no_geom), "list for stuck edges");
    RSS(ref_list_create(&para_cavity), "list for stuck cavity");
  }

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  ref_malloc(ratio, ref_edge_n(ref_edge), REF_DBL);
  ref_malloc(order, ref_edge_n(ref_edge), REF_INT);
  ref_malloc(edges, ref_edge_n(ref_edge), REF_INT);

  n = 0;
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_node_ratio(ref_node, node0, node1, &(ratio[n])), "ratio");
    if (ratio[n] > ref_grid_adapt(ref_grid, split_ratio)) {
      edges[n] = edge;
      n++;
    }
  }

  RSS(ref_sort_heap_dbl(n, ratio, order), "sort lengths");

  for (i = n - 1; i >= 0; i--) {
    edge = edges[order[i]];
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);

    /* transcript = (ratio[order[i]] > 3.0); */
    if (transcript) printf("transcript on ratio %f\n", ratio[order[i]]);

    RSS(ref_cell_has_side(ref_cell, node0, node1, &allowed), "has side");
    if (transcript && !allowed) printf("not a side anymore\n");
    if (!allowed) continue;

    /* skip if neither node is owned */
    if (!ref_node_owned(ref_node, node0) && !ref_node_owned(ref_node, node1)) {
      if (transcript) printf("neither node is local\n");
      continue;
    }

    RSS(ref_split_edge_mixed(ref_grid, node0, node1, &allowed), "mixed");
    if (transcript && !allowed) printf("mixed edge\n");
    if (!allowed) continue;

    weight_node1 = 0.5;
    if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
      RSS(ref_node_ratio(ref_node, node0, node1, &ratio01), "ratio01");
      RSS(ref_node_ratio_node0(ref_node, node0, node1, &ratio0), "ratio0");
      RSS(ref_node_ratio_node0(ref_node, node1, node0, &ratio1), "ratio1");
      if (ref_math_divisible(ratio0, ratio1 + ratio0)) {
        if (0.25 < ratio0 / (ratio0 + ratio1) &&
            ratio0 / (ratio0 + ratio1) < 0.75) {
          weight_node1 = 1.0 - ratio0 / (ratio0 + ratio1);
        } else {
          if (ratio0 < ratio1) {
            if (ref_math_divisible(ratio0, ratio01))
              weight_node1 = 1.0 - ratio0 / ratio01;
          } else {
            if (ref_math_divisible(ratio1, ratio01))
              weight_node1 = ratio1 / ratio01;
          }
        }
      }
    }
    weight_node1 = MIN(0.95, MAX(0.05, weight_node1));
    if (transcript) printf("weight_node1 %f\n", weight_node1);

    RSS(ref_node_next_global(ref_node, &global), "next global");
    RSS(ref_node_add(ref_node, global, &new_node), "new node");
    RSS(ref_node_interpolate_edge(ref_node, node0, node1, weight_node1,
                                  new_node),
        "interp new node");
    RSS(ref_geom_add_between(ref_grid, node0, node1, weight_node1, new_node),
        "geom new node");
    RSS(ref_geom_constrain(ref_grid, new_node), "geom constraint");
    RSS(ref_metric_interpolate_between(ref_grid, node0, node1, new_node),
        "interp new node metric");
    RSS(ref_geom_supported(ref_grid_geom(ref_grid), new_node, &geom_support),
        "geom support");
    if (transcript && geom_support) printf("geom support\n");

    if (transcript) {
      REF_DBL d0, d1;
      d0 = sqrt(pow(ref_node_xyz(ref_node, 0, node0) -
                        ref_node_xyz(ref_node, 0, new_node),
                    2) +
                pow(ref_node_xyz(ref_node, 1, node0) -
                        ref_node_xyz(ref_node, 1, new_node),
                    2) +
                pow(ref_node_xyz(ref_node, 2, node0) -
                        ref_node_xyz(ref_node, 2, new_node),
                    2));
      d1 = sqrt(pow(ref_node_xyz(ref_node, 0, node1) -
                        ref_node_xyz(ref_node, 0, new_node),
                    2) +
                pow(ref_node_xyz(ref_node, 1, node1) -
                        ref_node_xyz(ref_node, 1, new_node),
                    2) +
                pow(ref_node_xyz(ref_node, 2, node1) -
                        ref_node_xyz(ref_node, 2, new_node),
                    2));
      printf("w1 %f xyz %f %f %f d %f %f\nbetween %f %f %f %f %f %f\n",
             weight_node1, ref_node_xyz(ref_node, 0, new_node),
             ref_node_xyz(ref_node, 1, new_node),
             ref_node_xyz(ref_node, 2, new_node), d0, d1,
             ref_node_xyz(ref_node, 0, node0), ref_node_xyz(ref_node, 1, node0),
             ref_node_xyz(ref_node, 2, node0), ref_node_xyz(ref_node, 0, node1),
             ref_node_xyz(ref_node, 1, node1),
             ref_node_xyz(ref_node, 2, node1));
    }

    RSS(ref_split_edge_tet_quality(ref_grid, node0, node1, new_node,
                                   &allowed_tet_quality),
        "edge tet qual");
    if (transcript && !allowed_tet_quality) printf("tet quality poor\n");

    RSS(ref_split_edge_tri_quality(ref_grid, node0, node1, new_node,
                                   &allowed_tri_quality),
        "quality of new tri");
    if (transcript && !allowed_tri_quality) printf("tri quality poor\n");

    RSS(ref_split_edge_ratio(ref_grid, node0, node1, new_node, &allowed_ratio),
        "edge tet ratio");
    if (transcript && !allowed_ratio) printf("ratio poor\n");

    RSS(ref_split_edge_tri_conformity(transcript, ref_grid, node0, node1,
                                      new_node, &allowed_tri_conformity),
        "edge tri qual");
    if (transcript && !allowed_tri_conformity) printf("tri conformity poor\n");

    RSS(ref_cell_has_side(ref_grid_edg(ref_grid), node0, node1, &has_edge),
        "check for an edge");
    if (transcript && has_edge) printf("has geom edge\n");

    try_cavity = REF_FALSE;
    if (!allowed_tet_quality || !allowed_ratio || !allowed_tri_conformity ||
        !allowed_tri_quality) {
      if (geom_support) {
        try_cavity = REF_TRUE;
      } else {
        RSS(ref_node_remove(ref_node, new_node), "remove new node");
        RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), new_node), "rm");
        continue;
      }
    }

    if (try_cavity) {
      RSS(ref_cavity_create(&ref_cavity), "cav create");
      ref_cavity_debug(ref_cavity) = transcript;
      if (ref_grid_surf(ref_grid) && has_edge) {
        RSS(ref_node_ratio(ref_node, node0, node1, &ratio01), "ratio01");
        if (ratio01 > 5.0) ref_cavity_min_normdev(ref_cavity) = 0.0;
      }
      RSS(ref_cavity_form_edge_split(ref_cavity, ref_grid, node0, node1,
                                     new_node),
          "form edge split cav");
      if (transcript) {
        REF_BOOL normdev_improved;
        RSS(ref_cavity_normdev(ref_cavity, &normdev_improved), "nd");
        printf("form cavity status %d min normdev %f\n",
               (int)ref_cavity_state(ref_cavity),
               ref_cavity_min_normdev(ref_cavity));
      }
      if (REF_SUCCESS != ref_cavity_enlarge_combined(ref_cavity)) {
        RSS(ref_grid_tattle(ref_grid, node0), "tattle node0");
        RSS(ref_grid_tattle(ref_grid, node1), "tattle node1");
        REF_WHERE("enlarge"); /* note but skip cavity failures */
      }
      if (REF_CAVITY_VISIBLE == ref_cavity_state(ref_cavity)) {
        if (transcript) printf("cavity visible\n");
        RSS(ref_cavity_ratio(ref_cavity, &allowed_cavity_ratio),
            "cavity ratio");
        RSS(ref_cavity_change(ref_cavity, &min_del, &min_add), "cavity change");
        valid_cavity =
            (allowed_cavity_ratio || has_edge) &&
            (min_add > ref_grid_adapt(ref_grid, split_quality_absolute));
        if (transcript && !valid_cavity)
          printf("valid_cavity edge %d ratio %d add %d %f\n", has_edge,
                 allowed_cavity_ratio,
                 (min_add > ref_grid_adapt(ref_grid, split_quality_absolute)),
                 min_add);

        if (valid_cavity) {
          if (transcript) printf("cavity replace\n");
          RSS(ref_cavity_replace(ref_cavity), "cav replace");
          RSS(ref_cavity_free(ref_cavity), "cav free");
          ref_cavity = (REF_CAVITY)NULL;
          ref_node_age(ref_node, node0) = 0;
          ref_node_age(ref_node, node1) = 0;
          RSS(ref_smooth_post_edge_split(ref_grid, new_node),
              "smooth after split");
          continue;
        }
      } else {
        if (transcript) {
          REF_BOOL normdev_improved;
          RSS(ref_cavity_normdev(ref_cavity, &normdev_improved), "nd");
          printf("cavity not visible %d\n", (int)ref_cavity_state(ref_cavity));
        }
      }
      if (REF_CAVITY_PARTITION_CONSTRAINED == ref_cavity_state(ref_cavity)) {
        if (span_parts) RSS(ref_list_push(para_cavity, edge), "push");
      }
      RSS(ref_cavity_free(ref_cavity), "cav free");
      ref_cavity = (REF_CAVITY)NULL;
      RSS(ref_node_remove(ref_node, new_node), "remove new node");
      RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), new_node), "rm");
      continue;
    }

    RSS(ref_cell_local_gem(ref_cell, ref_node, node0, node1, &allowed_local),
        "local tet");
    if (!allowed_local) {
      if (span_parts) {
        RSS(ref_list_push(para_no_geom, edge), "push");
      } else {
        ref_node_age(ref_node, node0)++;
        ref_node_age(ref_node, node1)++;
      }
      RSS(ref_node_remove(ref_node, new_node), "remove new node");
      RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), new_node), "rm");
      continue;
    }

    if (transcript) printf("split\n");
    status = ref_split_edge(ref_grid, node0, node1, new_node);
    if (REF_INCREASE_LIMIT == status) {
      RSS(ref_node_remove(ref_node, new_node), "remove new node");
      RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), new_node), "rm");
      continue;
    }
    RSS(status, "tet edge split");

    if (transcript)
      RSS(ref_split_edge_ratio_post_report(ref_grid, node0, node1, new_node),
          "report ratio");
    ref_node_age(ref_node, node0) = 0;
    ref_node_age(ref_node, node1) = 0;

    RSS(ref_smooth_post_edge_split(ref_grid, new_node), "smooth after split");
  }

  ref_free(edges);
  ref_free(order);
  ref_free(ratio);

  if (span_parts) {
    if (ref_grid_adapt(ref_grid, timing_level) > 0)
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "spl int");
    RSS(ref_subdiv_create(&ref_subdiv, ref_grid), "create");
    ref_subdiv_new_mark_allowed(ref_subdiv) = REF_FALSE;
    ref_subdiv->instrument = REF_TRUE;
    each_ref_list_item(para_no_geom, i) {
      edge = ref_list_value(para_no_geom, i);
      node0 = ref_edge_e2n(ref_edge, 0, edge);
      node1 = ref_edge_e2n(ref_edge, 1, edge);
      RSS(ref_cell_has_side(ref_grid_tet(ref_grid), node0, node1, &allowed),
          "has side");
      if (!allowed) continue;

      RSS(ref_subdiv_mark_to_split(ref_subdiv, node0, node1),
          "mark edge to para split");
    }

    RSS(ref_subdiv_split(ref_subdiv), "split");
    RSS(ref_subdiv_free(ref_subdiv), "free");

    {
      REF_INT n_cavity;
      n_cavity = ref_list_n(para_cavity);
      RSS(ref_mpi_allsum(ref_mpi, &n_cavity, 1, REF_INT_TYPE), "cavs");
      if (ref_mpi_once(ref_mpi))
        printf("cavities with part constraints %d\n", n_cavity);
    }

    ref_list_free(para_no_geom);
    ref_list_free(para_cavity);
  }

  ref_edge_free(ref_edge);

  return REF_SUCCESS;
}